

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O1

int raviX_bitset_iterator_next(BitSetIterator *iter,size_t *nbit)

{
  ulong uVar1;
  bitset_el_t *pbVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  uVar3 = iter->nbit >> 6;
  uVar1 = iter->bitset->els_num;
  if (uVar3 < uVar1) {
    pbVar2 = iter->bitset->varr;
    sVar5 = uVar3 << 6;
    do {
      sVar5 = sVar5 + 0x40;
      uVar4 = pbVar2[uVar3];
      if ((uVar4 != 0) && (uVar4 = uVar4 >> ((byte)iter->nbit & 0x3f), uVar4 != 0)) {
        if ((uVar4 & 1) == 0) {
          sVar5 = iter->nbit;
          do {
            sVar5 = sVar5 + 1;
            uVar1 = uVar4 & 2;
            uVar4 = uVar4 >> 1;
          } while (uVar1 == 0);
          iter->nbit = sVar5;
        }
        sVar5 = iter->nbit;
        iter->nbit = sVar5 + 1;
        *nbit = sVar5;
        return 1;
      }
      uVar3 = uVar3 + 1;
      iter->nbit = sVar5;
    } while (uVar1 != uVar3);
  }
  return 0;
}

Assistant:

int raviX_bitset_iterator_next(BitSetIterator *iter, size_t *nbit) {
	const size_t el_bits_num = sizeof (bitset_el_t) * CHAR_BIT;
	size_t curr_nel = iter->nbit / el_bits_num, len = iter->bitset->els_num;
	bitset_el_t el, *addr = iter->bitset->varr;

	for (; curr_nel < len; curr_nel++, iter->nbit = curr_nel * el_bits_num)
		if ((el = addr[curr_nel]) != 0)
			for (el >>= iter->nbit % el_bits_num; el != 0; el >>= 1, iter->nbit++)
				if (el & 1) {
					*nbit = iter->nbit++;
					return true;
				}
	return false;
}